

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_begin_sb(telnet_t *telnet,int telopt)

{
  char local_19 [5];
  undefined1 auStack_14 [3];
  uchar sb [5];
  int telopt_local;
  telnet_t *telnet_local;
  
  _auStack_14 = telopt;
  unique0x100000a2 = telnet;
  if (telopt < 0x200) {
    local_19[4] = (char)telopt;
    if (telopt < 0x100) {
      local_19[0] = -1;
      local_19[1] = 0xfa;
      local_19[2] = local_19[4];
      _send(telnet,local_19,3);
    }
    else {
      local_19[0] = -1;
      local_19[1] = 0xfa;
      local_19[2] = 0xff;
      local_19[3] = 0xfa;
      _send(telnet,local_19,5);
    }
  }
  else {
    _error(telnet,0x5e4,"telnet_begin_sb",TELNET_EBADVAL,0,
           "supplied telopt %d for subnegotiation is greater than 511",telopt);
  }
  return;
}

Assistant:

void telnet_begin_sb(telnet_t *telnet, int telopt) {
	unsigned char sb[5];

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for subnegotiation is greater than 511", telopt);
		return;
	}

	if (telopt > 255) {
		/* an EXOPL telopt */
		
		sb[0] = TELNET_IAC;
		sb[1] = TELNET_SB;
		sb[2] = TELNET_TELOPT_EXOPL;
		sb[3] = TELNET_SB;
		sb[4] = (unsigned char)(telopt - 256);

		_sendu(telnet, sb, 5);

		return;
	}
	
	sb[0] = TELNET_IAC;
	sb[1] = TELNET_SB;
	sb[2] = telopt;
	_sendu(telnet, sb, 3);
}